

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void stat_cb(uv_fs_t *req)

{
  uv_fs_t *req_local;
  
  if (req != &stat_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x29a,"req == &stat_req");
    abort();
  }
  if ((stat_req.fs_type != UV_FS_STAT) && (stat_req.fs_type != UV_FS_LSTAT)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x29b,"req->fs_type == UV_FS_STAT || req->fs_type == UV_FS_LSTAT");
    abort();
  }
  if (stat_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x29c,"req->result == 0");
    abort();
  }
  if (stat_req.ptr == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x29d,"req->ptr");
    abort();
  }
  stat_cb_count = stat_cb_count + 1;
  uv_fs_req_cleanup(&stat_req);
  if (stat_req.ptr != (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x2a0,"!req->ptr");
    abort();
  }
  return;
}

Assistant:

static void stat_cb(uv_fs_t* req) {
  ASSERT(req == &stat_req);
  ASSERT(req->fs_type == UV_FS_STAT || req->fs_type == UV_FS_LSTAT);
  ASSERT(req->result == 0);
  ASSERT(req->ptr);
  stat_cb_count++;
  uv_fs_req_cleanup(req);
  ASSERT(!req->ptr);
}